

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

int bn_print(BIO *bp,char *name,BIGNUM *num,int off)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *orig_ptr;
  char *pcVar4;
  size_t size;
  uchar *data;
  uchar *to;
  ulong uVar5;
  uint64_t u64;
  
  if (num == (BIGNUM *)0x0) {
    uVar3 = 1;
  }
  else {
    iVar1 = BIO_indent((BIO *)bp,off,0x80);
    if (iVar1 == 0) {
      uVar3 = 0;
    }
    else {
      iVar1 = BN_is_zero(num);
      if (iVar1 == 0) {
        iVar1 = BN_get_u64(num,&u64);
        iVar2 = BN_is_negative(num);
        if (iVar1 == 0) {
          pcVar4 = " (Negative)";
          if (iVar2 == 0) {
            pcVar4 = "";
          }
          iVar1 = BIO_printf((BIO *)bp,"%s%s",name,pcVar4);
          if (iVar1 < 1) {
            return 0;
          }
          uVar3 = BN_num_bytes(num);
          uVar5 = (ulong)uVar3;
          size = uVar5 + 1;
          orig_ptr = (uint8_t *)OPENSSL_malloc(size);
          if (orig_ptr == (uint8_t *)0x0) {
            return 0;
          }
          *orig_ptr = '\0';
          to = orig_ptr + 1;
          BN_bn2bin((BIGNUM *)num,to);
          if ((uVar5 == 0) || (data = orig_ptr, -1 < (char)*to)) {
            size = uVar5;
            data = to;
          }
          iVar1 = print_hex(bp,data,size,off);
          OPENSSL_free(orig_ptr);
          return iVar1;
        }
        pcVar4 = "-";
        if (iVar2 == 0) {
          pcVar4 = "";
        }
        iVar1 = BIO_printf((BIO *)bp,"%s %s%lu (%s0x%lx)\n",name,pcVar4,u64,pcVar4,u64);
      }
      else {
        iVar1 = BIO_printf((BIO *)bp,"%s 0\n",name);
      }
      uVar3 = (uint)(0 < iVar1);
    }
  }
  return uVar3;
}

Assistant:

static int bn_print(BIO *bp, const char *name, const BIGNUM *num, int off) {
  if (num == NULL) {
    return 1;
  }

  if (!BIO_indent(bp, off, 128)) {
    return 0;
  }
  if (BN_is_zero(num)) {
    if (BIO_printf(bp, "%s 0\n", name) <= 0) {
      return 0;
    }
    return 1;
  }

  uint64_t u64;
  if (BN_get_u64(num, &u64)) {
    const char *neg = BN_is_negative(num) ? "-" : "";
    return BIO_printf(bp, "%s %s%" PRIu64 " (%s0x%" PRIx64 ")\n", name, neg,
                      u64, neg, u64) > 0;
  }

  if (BIO_printf(bp, "%s%s", name,
                 (BN_is_negative(num)) ? " (Negative)" : "") <= 0) {
    return 0;
  }

  // Print |num| in hex, adding a leading zero, as in ASN.1, if the high bit
  // is set.
  //
  // TODO(davidben): Do we need to do this? We already print "(Negative)" above
  // and negative values are never valid in keys anyway.
  size_t len = BN_num_bytes(num);
  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len + 1));
  if (buf == NULL) {
    return 0;
  }

  buf[0] = 0;
  BN_bn2bin(num, buf + 1);
  int ret;
  if (len > 0 && (buf[1] & 0x80) != 0) {
    // Print the whole buffer.
    ret = print_hex(bp, buf, len + 1, off);
  } else {
    // Skip the leading zero.
    ret = print_hex(bp, buf + 1, len, off);
  }
  OPENSSL_free(buf);
  return ret;
}